

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O3

optional_idx duckdb::FileSystem::GetAvailableDiskSpace(string *path)

{
  bool bVar1;
  int iVar2;
  optional_idx oVar3;
  idx_t available_disk_space;
  statvfs vfs;
  uint64_t local_88;
  optional_idx local_80;
  statvfs local_78;
  
  iVar2 = statvfs((path->_M_dataplus)._M_p,&local_78);
  if (iVar2 == -1) {
    oVar3.index = 0xffffffffffffffff;
  }
  else {
    local_88 = 0xffffffffffffffff;
    bVar1 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                      (local_78.f_frsize,local_78.f_bfree,&local_88);
    oVar3.index = 0xffffffffffffffff;
    if (bVar1) {
      optional_idx::optional_idx(&local_80,local_88);
      oVar3.index = local_80.index;
    }
  }
  return (optional_idx)oVar3.index;
}

Assistant:

static bool StartsWithSingleBackslash(const string &path) {
	if (path.size() < 2) {
		return false;
	}
	if (path[0] != '/' && path[0] != '\\') {
		return false;
	}
	if (path[1] == '/' || path[1] == '\\') {
		return false;
	}
	return true;
}